

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O2

void OPENSSL_lh_doall_arg(_LHASH *lh,_func_void_void_ptr_void_ptr *func,void *arg)

{
  void **ppvVar1;
  size_t i;
  ulong uVar2;
  LHASH_ITEM *pLVar3;
  
  if (lh != (_LHASH *)0x0) {
    if (lh->callback_depth != 0xffffffff) {
      lh->callback_depth = lh->callback_depth + 1;
    }
    for (uVar2 = 0; uVar2 < lh->num_buckets; uVar2 = uVar2 + 1) {
      pLVar3 = lh->buckets[uVar2];
      while (pLVar3 != (LHASH_ITEM *)0x0) {
        ppvVar1 = &pLVar3->data;
        pLVar3 = pLVar3->next;
        (*func)(*ppvVar1,arg);
      }
    }
    if (lh->callback_depth != 0xffffffff) {
      lh->callback_depth = lh->callback_depth - 1;
    }
    lh_maybe_resize(lh);
    return;
  }
  return;
}

Assistant:

void OPENSSL_lh_doall_arg(_LHASH *lh, void (*func)(void *, void *), void *arg) {
  if (lh == NULL) {
    return;
  }

  if (lh->callback_depth < UINT_MAX) {
    // |callback_depth| is a saturating counter.
    lh->callback_depth++;
  }

  for (size_t i = 0; i < lh->num_buckets; i++) {
    LHASH_ITEM *next;
    for (LHASH_ITEM *cur = lh->buckets[i]; cur != NULL; cur = next) {
      next = cur->next;
      func(cur->data, arg);
    }
  }

  if (lh->callback_depth < UINT_MAX) {
    lh->callback_depth--;
  }

  // The callback may have added or removed elements and the non-zero value of
  // |callback_depth| will have suppressed any resizing. Thus any needed
  // resizing is done here.
  lh_maybe_resize(lh);
}